

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O0

int __thiscall
kj::anon_unknown_0::ConnectHttpService::connect
          (ConnectHttpService *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  undefined4 in_register_0000000c;
  undefined4 in_register_00000034;
  HttpHeaders *pHVar1;
  AsyncIoStream *in_R9;
  undefined8 *in_stack_00000008;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_c8 [2];
  HttpHeaders local_a8;
  StringPtr local_48;
  AsyncIoStream *local_38;
  AsyncIoStream *connection_local;
  HttpHeaders *headers_local;
  ConnectHttpService *this_local;
  StringPtr host_local;
  
  pHVar1 = (HttpHeaders *)CONCAT44(in_register_00000034,__fd);
  host_local.content.ptr = (char *)CONCAT44(in_register_0000000c,__len);
  local_38 = in_R9;
  headers_local = pHVar1;
  this_local = (ConnectHttpService *)__addr;
  host_local.content.size_ = (size_t)this;
  StringPtr::StringPtr(&local_48,"OK");
  HttpHeaders::HttpHeaders(&local_a8,(HttpHeaderTable *)(pHVar1->unindexedHeaders).builder.disposer)
  ;
  (**(code **)*in_stack_00000008)
            (in_stack_00000008,200,local_48.content.ptr,local_48.content.size_,&local_a8);
  HttpHeaders::~HttpHeaders(&local_a8);
  Own<kj::AsyncIoStream,_std::nullptr_t>::Own(local_c8,local_38,(Disposer *)&NullDisposer::instance)
  ;
  HttpServer::listenHttp
            ((HttpServer *)this,(Own<kj::AsyncIoStream,_std::nullptr_t> *)&pHVar1->ownedStrings);
  Own<kj::AsyncIoStream,_std::nullptr_t>::~Own(local_c8);
  return (int)this;
}

Assistant:

kj::Promise<void> connect(kj::StringPtr host,
                            const HttpHeaders& headers,
                            kj::AsyncIoStream& connection,
                            ConnectResponse& response,
                            kj::HttpConnectSettings settings) override {
    response.accept(200, "OK", HttpHeaders(tunneledService.table));
    return server.listenHttp(kj::Own<kj::AsyncIoStream>(&connection, kj::NullDisposer::instance));
  }